

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

double __thiscall NEST::LArNEST::GetPhotonEnergy(LArNEST *this,bool state)

{
  RandomGen *this_00;
  undefined3 in_register_00000031;
  double dVar1;
  double sigma;
  
  this_00 = RandomGen::rndm();
  if (CONCAT31(in_register_00000031,state) == 0) {
    dVar1 = 9.69;
    sigma = 0.22;
  }
  else {
    dVar1 = 9.7;
    sigma = 0.2;
  }
  dVar1 = RandomGen::rand_zero_trunc_gauss(this_00,dVar1,sigma);
  return dVar1;
}

Assistant:

double LArNEST::GetPhotonEnergy(bool state) {
  // liquid Argon
  // TODO: What is this function about?
  if (state) {
    return RandomGen::rndm()->rand_zero_trunc_gauss(9.7, 0.2);
  } else {
    return RandomGen::rndm()->rand_zero_trunc_gauss(9.69, 0.22);
  }
}